

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O0

void DumpFunction(Proto *f,DumpState *D)

{
  DumpState *D_local;
  Proto *f_local;
  
  DumpInt(f->linedefined,D);
  DumpInt(f->lastlinedefined,D);
  DumpChar((uint)f->numparams,D);
  DumpChar((uint)f->is_vararg,D);
  DumpChar((uint)f->maxstacksize,D);
  DumpVector(f->code,f->sizecode,4,D);
  DumpConstants(f,D);
  DumpUpvalues(f,D);
  DumpDebug(f,D);
  return;
}

Assistant:

static void DumpFunction(const Proto* f, DumpState* D)
{
 DumpInt(f->linedefined,D);
 DumpInt(f->lastlinedefined,D);
 DumpChar(f->numparams,D);
 DumpChar(f->is_vararg,D);
 DumpChar(f->maxstacksize,D);
 DumpCode(f,D);
 DumpConstants(f,D);
 DumpUpvalues(f,D);
 DumpDebug(f,D);
}